

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O1

void __thiscall Fl_Tree::clear(Fl_Tree *this)

{
  Fl_Tree_Item *this_00;
  
  if (this->_root != (Fl_Tree_Item *)0x0) {
    Fl_Tree_Item::clear_children(this->_root);
    this_00 = this->_root;
    if (this_00 != (Fl_Tree_Item *)0x0) {
      Fl_Tree_Item::~Fl_Tree_Item(this_00);
      operator_delete(this_00,0x88);
    }
    this->_root = (Fl_Tree_Item *)0x0;
    this->_item_focus = (Fl_Tree_Item *)0x0;
  }
  return;
}

Assistant:

void Fl_Tree::clear() {
  if ( ! _root ) return;
  _root->clear_children();
  delete _root; _root = 0;
  _item_focus = 0;
#if FLTK_ABI_VERSION >= 10301
  _lastselect = 0;
#endif /*FLTK_ABI_VERSION*/
}